

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTlsPrivate::X509CertificateBase::X509CertificateExtension>::Inserter::
insertOne(Inserter *this,qsizetype pos,X509CertificateExtension *t)

{
  qsizetype in_RSI;
  X509CertificateExtension *in_RDI;
  qsizetype i;
  X509CertificateExtension *in_stack_ffffffffffffffe0;
  X509CertificateExtension *this_00;
  
  setup((Inserter *)in_RDI,in_RSI,1);
  if ((in_RDI->name).d.d == (Data *)0x0) {
    QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
              (in_stack_ffffffffffffffe0,in_RDI);
    (in_RDI->oid).d.size = (in_RDI->oid).d.size + 1;
    for (this_00 = (X509CertificateExtension *)0x0;
        this_00 != (X509CertificateExtension *)(in_RDI->name).d.size;
        this_00 = (X509CertificateExtension *)&this_00[-1].field_0x57) {
      QTlsPrivate::X509CertificateBase::X509CertificateExtension::operator=(this_00,in_RDI);
    }
    QTlsPrivate::X509CertificateBase::X509CertificateExtension::operator=(this_00,in_RDI);
  }
  else {
    QTlsPrivate::X509CertificateBase::X509CertificateExtension::X509CertificateExtension
              (in_stack_ffffffffffffffe0,in_RDI);
    (in_RDI->oid).d.size = (in_RDI->oid).d.size + 1;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }